

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractmodelserialiser.cpp
# Opt level: O2

void __thiscall
AbstractModelSerialiser::AbstractModelSerialiser(AbstractModelSerialiser *this,QObject *parent)

{
  AbstractModelSerialiserPrivate *this_00;
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_00167670;
  this_00 = (AbstractModelSerialiserPrivate *)operator_new(0x38);
  AbstractModelSerialiserPrivate::AbstractModelSerialiserPrivate(this_00,this);
  (this->d_ptr).d = this_00;
  return;
}

Assistant:

AbstractModelSerialiser::AbstractModelSerialiser(QObject *parent)
    : QObject(parent)
    , d_ptr(new AbstractModelSerialiserPrivate(this))
{ }